

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_CoordSys.cpp
# Opt level: O0

ostream * amrex::operator<<(ostream *os,CoordSys *c)

{
  CoordType CVar1;
  ostream *poVar2;
  CoordSys *in_RSI;
  ostream *in_RDI;
  Real RVar3;
  
  poVar2 = std::operator<<(in_RDI,'(');
  CVar1 = CoordSys::Coord(in_RSI);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,CVar1);
  std::operator<<(poVar2,' ');
  poVar2 = std::operator<<(in_RDI,'(');
  RVar3 = CoordSys::Offset(in_RSI,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar3);
  poVar2 = std::operator<<(poVar2,',');
  RVar3 = CoordSys::Offset(in_RSI,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar3);
  poVar2 = std::operator<<(poVar2,',');
  RVar3 = CoordSys::Offset(in_RSI,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar3);
  std::operator<<(poVar2,')');
  poVar2 = std::operator<<(in_RDI,'(');
  RVar3 = CoordSys::CellSize(in_RSI,0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar3);
  poVar2 = std::operator<<(poVar2,',');
  RVar3 = CoordSys::CellSize(in_RSI,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar3);
  poVar2 = std::operator<<(poVar2,',');
  RVar3 = CoordSys::CellSize(in_RSI,2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,RVar3);
  std::operator<<(poVar2,')');
  poVar2 = std::operator<<(in_RDI,' ');
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(uint)(in_RSI->ok & 1));
  std::operator<<(poVar2,")\n");
  return in_RDI;
}

Assistant:

std::ostream&
operator<< (std::ostream&   os,
            const CoordSys& c)
{
    os << '(' << (int) c.Coord() << ' ';
    os << AMREX_D_TERM( '(' << c.Offset(0) , <<
                  ',' << c.Offset(1) , <<
                  ',' << c.Offset(2))  << ')';
    os << AMREX_D_TERM( '(' << c.CellSize(0) , <<
                  ',' << c.CellSize(1) , <<
                  ',' << c.CellSize(2))  << ')';
    os << ' ' << int(c.ok) << ")\n";
    return os;
}